

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_ImFontConfig_push_back(ImVector_ImFontConfig *self,ImFontConfig v)

{
  ImVector_ImFontConfig *self_local;
  
  ImVector<ImFontConfig>::push_back(self,&v);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImFontConfig_push_back(ImVector_ImFontConfig* self,const ImFontConfig v)
{
    return self->push_back(v);
}